

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

string * showVec_abi_cxx11_(string *__return_storage_ptr__,vec<int> *v)

{
  ulong uVar1;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (v->sz != 0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
      }
      std::ostream::operator<<((ostream *)local_1a0,v->data[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < v->sz);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string showVec(const vec<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}